

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O3

void helper_pcmpistrm_xmm_x86_64(CPUX86State *env,ZMMReg *d,ZMMReg *s,uint32_t ctrl)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = 0;
  if ((ctrl & 1) == 0) {
    do {
      if (s->_b_ZMMReg[lVar2] == '\0') goto LAB_0051226e;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x10);
    lVar2 = 0x10;
  }
  else {
    do {
      if (s->_w_ZMMReg[lVar2] == 0) goto LAB_0051226e;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 8);
    lVar2 = 8;
  }
LAB_0051226e:
  lVar3 = 0;
  if ((ctrl & 1) == 0) {
    do {
      if (d->_b_ZMMReg[lVar3] == '\0') goto LAB_005122a6;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x10);
    lVar3 = 0x10;
  }
  else {
    do {
      if (d->_w_ZMMReg[lVar3] == 0) goto LAB_005122a6;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 8);
    lVar3 = 8;
  }
LAB_005122a6:
  uVar1 = pcmpxstrx(env,d,s,(int8_t)ctrl,(int)lVar2,(int)lVar3);
  if ((ctrl & 0x40) == 0) {
    env->xmm_regs[0]._q_ZMMReg[1] = 0;
    *(ulong *)env->xmm_regs = (ulong)uVar1;
  }
  else {
    lVar2 = 0;
    if ((ctrl & 1) == 0) {
      do {
        env->xmm_regs[0]._b_ZMMReg[lVar2] = -((byte)uVar1 & 1);
        lVar2 = lVar2 + 1;
        uVar1 = uVar1 >> 1;
      } while (lVar2 != 0x10);
    }
    else {
      do {
        *(ushort *)((long)env->xmm_regs + lVar2 * 2) = -((ushort)uVar1 & 1);
        lVar2 = lVar2 + 1;
        uVar1 = uVar1 >> 1;
      } while (lVar2 != 8);
    }
  }
  return;
}

Assistant:

void glue(helper_pcmpistrm, SUFFIX)(CPUX86State *env, Reg *d, Reg *s,
                                    uint32_t ctrl)
{
    int i;
    unsigned int res = pcmpxstrx(env, d, s, ctrl,
                                 pcmp_ilen(s, ctrl),
                                 pcmp_ilen(d, ctrl));

    if ((ctrl >> 6) & 1) {
        if (ctrl & 1) {
            for (i = 0; i < 8; i++, res >>= 1) {
                env->xmm_regs[0].W(i) = (res & 1) ? ~0 : 0;
            }
        } else {
            for (i = 0; i < 16; i++, res >>= 1) {
                env->xmm_regs[0].B(i) = (res & 1) ? ~0 : 0;
            }
        }
    } else {
        env->xmm_regs[0].Q(1) = 0;
        env->xmm_regs[0].Q(0) = res;
    }
}